

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_maps.cpp
# Opt level: O3

int (anonymous_namespace)::
    bench<poplar::map<poplar::plain_fkhash_trie<90u,poplar::hash::vigna_hasher>,poplar::compact_fkhash_nlm<int,8ul>>>
              (parser *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint capa_bits;
  pointer pcVar2;
  pointer pbVar3;
  uint8_t *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  char cVar9;
  int iVar10;
  int iVar11;
  const_iterator __end1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  uint *puVar13;
  unsigned_long *puVar14;
  int *piVar15;
  bool *pbVar16;
  FILE *pFVar17;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
  *pmVar18;
  ostream *poVar19;
  istream *piVar20;
  value_type *pvVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  long lVar24;
  long lVar25;
  string *query;
  pointer pbVar26;
  double dVar27;
  const_iterator __begin1;
  _Alloc_hider _Var28;
  const_iterator __begin1_1;
  double dVar29;
  size_type __n;
  double dVar30;
  double __n_00;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  double min;
  undefined1 auVar35 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  char_range key;
  char_range key_00;
  char_range key_01;
  size_t vm;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  queries;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keys;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key_fn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query_fn;
  string indent;
  value_type local_310;
  char local_2e9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2d0;
  double local_2c8;
  unsigned_long local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
  *local_2a0;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
  *local_298;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
  *local_290;
  long *local_288;
  long local_280;
  long local_278 [2];
  long *local_268;
  long local_260;
  long local_258 [2];
  long local_248;
  ulong local_240;
  string local_238;
  byte abStack_218 [488];
  undefined1 extraout_var [56];
  
  paVar1 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"key_fn","");
  pbVar12 = cmdline::parser::get<std::__cxx11::string>(p,&local_238);
  local_288 = local_278;
  pcVar2 = (pbVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar2,pcVar2 + pbVar12->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"query_fn","");
  pbVar12 = cmdline::parser::get<std::__cxx11::string>(p,&local_238);
  local_268 = local_258;
  pcVar2 = (pbVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,pcVar2,pcVar2 + pbVar12->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"capa_bits","");
  puVar13 = cmdline::parser::get<unsigned_int>(p,&local_238);
  capa_bits = *puVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"lambda","");
  puVar14 = cmdline::parser::get<unsigned_long>(p,&local_238);
  local_2c0 = *puVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"runs","");
  piVar15 = cmdline::parser::get<int>(p,&local_238);
  iVar11 = *piVar15;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"detail","");
  pbVar16 = cmdline::parser::get<bool>(p,&local_238);
  local_2e9 = *pbVar16;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  pFVar17 = fopen("/proc/self/statm","r");
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_310._M_dataplus._M_p = (pointer)0x0;
  __isoc99_fscanf(pFVar17,"%ld %ld ");
  fclose(pFVar17);
  _Var28._M_p = local_310._M_dataplus._M_p;
  iVar10 = getpagesize();
  pmVar18 = (map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
             *)operator_new(0x1f0);
  poplar::
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
  ::map(pmVar18,capa_bits,local_2c0);
  local_290 = pmVar18;
  std::ifstream::ifstream(&local_238,(string *)&local_288,_S_in);
  if ((abStack_218[(long)*(double *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: failed to open ",0x16);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_288,local_280);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
    std::ifstream::~ifstream(&local_238);
    iVar11 = 1;
    goto LAB_00135bb7;
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310._M_string_length = 0;
  local_310.field_2._M_local_buf[0] = '\0';
  local_2c8 = (double)(long)iVar11;
  local_2a0 = pmVar18;
  std::__cxx11::string::reserve((ulong)&local_310);
  __n = 0;
  while( true ) {
    cVar9 = std::ios::widen(SUB81(*(double *)(local_238._M_dataplus._M_p + -0x18),0) +
                            (char)&local_238);
    piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_238,(string *)&local_310,cVar9);
    if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
    key.end = (uint8_t *)(local_310._M_dataplus._M_p + 1 + local_310._M_string_length);
    key.begin = (uint8_t *)local_310._M_dataplus._M_p;
    pvVar21 = poplar::
              map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
              ::update(local_2a0,key);
    *pvVar21 = 1;
    __n = __n + 1;
  }
  pFVar17 = fopen("/proc/self/statm","r");
  local_2d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __isoc99_fscanf(pFVar17,"%ld %ld ");
  fclose(pFVar17);
  p_Var23 = local_2e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                             local_310.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(&local_238);
  local_2d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::ifstream::ifstream(&local_238,(string *)&local_288,_S_in);
  if ((abStack_218[(long)*(double *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
    local_240 = (ulong)capa_bits;
    p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    _Var8._M_pi = _Stack_2d0._M_pi;
    local_2d8 = p_Var22 + 1;
    p_Var22->_M_use_count = 1;
    p_Var22->_M_weak_count = 1;
    p_Var22->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00183a78;
    p_Var22[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var22[1]._M_use_count = 0;
    p_Var22[1]._M_weak_count = 0;
    p_Var22[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    bVar31 = _Stack_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_2d0._M_pi = p_Var22;
    if (bVar31) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8,__n);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    local_248 = ((long)p_Var23 - (long)_Var28._M_p) * (long)iVar10;
    local_310._M_string_length = 0;
    local_310.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar9 = std::ios::widen(SUB81(*(double *)(local_238._M_dataplus._M_p + -0x18),0) +
                              (char)&local_238);
      piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&local_238,(string *)&local_310,cVar9);
      if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8,&local_310);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,
                      CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                               local_310.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(&local_238);
    iVar11 = std::__cxx11::string::compare((char *)&local_268);
    __n_00 = local_2c8;
    if (iVar11 == 0) {
      local_2e8 = local_2d8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_2e0,&_Stack_2d0);
    }
    else {
      std::ifstream::ifstream(&local_238,(string *)&local_268,_S_in);
      if ((abStack_218[(long)*(double *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: failed to open ",0x16);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)local_268,local_260);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
        std::ostream::put((char)poVar19);
        std::ostream::flush();
        goto LAB_00135b87;
      }
      p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
      _Var8._M_pi = _Stack_2e0._M_pi;
      local_2e8 = p_Var23 + 1;
      p_Var23->_M_use_count = 1;
      p_Var23->_M_weak_count = 1;
      p_Var23->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00183a78;
      p_Var23[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var23[1]._M_use_count = 0;
      p_Var23[1]._M_weak_count = 0;
      p_Var23[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      bVar31 = _Stack_2e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Stack_2e0._M_pi = p_Var23;
      if (bVar31) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
      }
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      local_310._M_string_length = 0;
      local_310.field_2._M_local_buf[0] = '\0';
      while( true ) {
        cVar9 = std::ios::widen(SUB81(*(double *)(local_238._M_dataplus._M_p + -0x18),0) +
                                (char)&local_238);
        piVar20 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&local_238,(string *)&local_310,cVar9);
        if (((byte)piVar20[*(long *)(*(long *)piVar20 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2e8,&local_310);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,
                        CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                                 local_310.field_2._M_local_buf[0]) + 1);
      }
      __n_00 = local_2c8;
      if ((pointer)local_2e8[1]._vptr__Sp_counted_base != *(pointer *)&local_2e8->_M_use_count) {
        std::
        __shrink_to_fit_aux<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
        ::_S_do_it((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e8);
      }
      std::ifstream::~ifstream(&local_238);
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_238,(size_type)__n_00,
               (allocator_type *)&local_310);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_310,(size_type)__n_00,
               (allocator_type *)&local_298);
    if (0 < SUB84(__n_00,0)) {
      dVar27 = 0.0;
      local_2b0 = 0.0;
      local_2b8 = 0.0;
      do {
        pmVar18 = (map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
                   *)operator_new(0x1f0);
        poplar::
        map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
        ::map(pmVar18,(uint32_t)local_240,local_2c0);
        local_298 = pmVar18;
        lVar24 = std::chrono::_V2::system_clock::now();
        pbVar3 = *(pointer *)&local_2d8->_M_use_count;
        for (pbVar26 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2d8->_vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data.
                       _M_start; pbVar26 != pbVar3; pbVar26 = pbVar26 + 1) {
          puVar4 = (uint8_t *)(pbVar26->_M_dataplus)._M_p;
          key_00.end = puVar4 + pbVar26->_M_string_length + 1;
          key_00.begin = puVar4;
          pvVar21 = poplar::
                    map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
                    ::update(pmVar18,key_00);
          *pvVar21 = 1;
        }
        lVar25 = std::chrono::_V2::system_clock::now();
        auVar35._8_8_ = in_XMM2_Qb;
        auVar35._0_8_ = in_XMM2_Qa;
        auVar35 = vcvtusi2sd_avx512f(auVar35,(long)*(pointer *)&local_2d8->_M_use_count -
                                             (long)(((
                                                  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_2d8->_vptr__Sp_counted_base)->_M_impl).
                                                  super__Vector_impl_data._M_start >> 5);
        *(double *)(local_238._M_dataplus._M_p + (long)dVar27 * 8) =
             ((double)(lVar25 - lVar24) / 1000.0) / auVar35._0_8_;
        local_2a8 = (double)std::chrono::_V2::system_clock::now();
        pbVar26 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2e8->_vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data.
                  _M_start;
        pbVar3 = *(pointer *)&local_2e8->_M_use_count;
        if (pbVar26 == pbVar3) {
          dVar30 = 0.0;
          dVar29 = 0.0;
        }
        else {
          dVar29 = 0.0;
          dVar30 = 0.0;
          do {
            puVar4 = (uint8_t *)(pbVar26->_M_dataplus)._M_p;
            key_01.end = puVar4 + pbVar26->_M_string_length + 1;
            key_01.begin = puVar4;
            pvVar21 = poplar::
                      map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
                      ::find(pmVar18,key_01);
            if ((pvVar21 == (value_type *)0x0) || (*pvVar21 != 1)) {
              dVar29 = (double)((long)dVar29 + 1);
            }
            else {
              dVar30 = (double)((long)dVar30 + 1);
            }
            pbVar26 = pbVar26 + 1;
          } while (pbVar26 != pbVar3);
        }
        lVar24 = std::chrono::_V2::system_clock::now();
        auVar5._8_8_ = in_XMM2_Qb;
        auVar5._0_8_ = in_XMM2_Qa;
        auVar35 = vcvtusi2sd_avx512f(auVar5,(long)*(pointer *)&local_2e8->_M_use_count -
                                            (long)(((
                                                  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_2e8->_vptr__Sp_counted_base)->_M_impl).
                                                  super__Vector_impl_data._M_start >> 5);
        *(double *)(local_310._M_dataplus._M_p + (long)dVar27 * 8) =
             ((double)(lVar24 - (long)local_2a8) / 1000.0) / auVar35._0_8_;
        if ((dVar27 != 0.0) && ((local_2b0 != dVar30 || (local_2b8 != dVar29)))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"critical error for search results",0x21);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
          std::ostream::put(-0x40);
          std::ostream::flush();
          poplar::compact_fkhash_nlm<int,_8UL>::~compact_fkhash_nlm(&pmVar18->label_store_);
          poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::~plain_fkhash_trie
                    (&pmVar18->hash_trie_);
          operator_delete(pmVar18,0x1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_310._M_dataplus._M_p,
                            CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                                     local_310.field_2._M_local_buf[0]) -
                            (long)local_310._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_238._M_dataplus._M_p,
                            local_238.field_2._M_allocated_capacity -
                            (long)local_238._M_dataplus._M_p);
          }
          goto LAB_00135b94;
        }
        poplar::compact_fkhash_nlm<int,_8UL>::~compact_fkhash_nlm(&pmVar18->label_store_);
        poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::~plain_fkhash_trie
                  (&pmVar18->hash_trie_);
        operator_delete(pmVar18,0x1f0);
        dVar27 = (double)((long)dVar27 + 1);
        __n_00 = local_2c8;
        local_2b8 = dVar29;
        local_2b0 = dVar30;
      } while (dVar27 != local_2c8);
    }
    if (local_238._M_dataplus._M_p == (pointer)local_238._M_string_length) {
      local_2b0 = 1.79769313486232e+308;
      local_2a8 = NAN;
    }
    else {
      local_2a8 = 0.0;
      _Var28._M_p = local_238._M_dataplus._M_p;
      do {
        local_2a8 = local_2a8 + *(double *)_Var28._M_p;
        _Var28._M_p = _Var28._M_p + 8;
      } while (_Var28._M_p != (pointer)local_238._M_string_length);
      auVar6._8_8_ = in_XMM2_Qb;
      auVar6._0_8_ = in_XMM2_Qa;
      auVar35 = vcvtusi2sd_avx512f(auVar6,(long)(local_238._M_string_length -
                                                (long)local_238._M_dataplus._M_p) >> 3);
      local_2a8 = local_2a8 / auVar35._0_8_;
      auVar35 = ZEXT816(0x7fefffffffffffff);
      _Var28._M_p = local_238._M_dataplus._M_p;
      do {
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(double *)_Var28._M_p;
        _Var28._M_p = _Var28._M_p + 8;
        auVar35 = vminsd_avx(auVar32,auVar35);
      } while (_Var28._M_p != (pointer)local_238._M_string_length);
      local_2b0 = auVar35._0_8_;
    }
    if (local_310._M_dataplus._M_p == (pointer)local_310._M_string_length) {
      local_2c8 = 1.79769313486232e+308;
      local_2b8 = NAN;
    }
    else {
      local_2b8 = 0.0;
      _Var28._M_p = local_310._M_dataplus._M_p;
      do {
        local_2b8 = local_2b8 + *(double *)_Var28._M_p;
        _Var28._M_p = _Var28._M_p + 8;
      } while (_Var28._M_p != (pointer)local_310._M_string_length);
      auVar7._8_8_ = in_XMM2_Qb;
      auVar7._0_8_ = in_XMM2_Qa;
      auVar35 = vcvtusi2sd_avx512f(auVar7,(long)(local_310._M_string_length -
                                                (long)local_310._M_dataplus._M_p) >> 3);
      local_2b8 = local_2b8 / auVar35._0_8_;
      auVar35 = ZEXT816(0x7fefffffffffffff);
      _Var28._M_p = local_310._M_dataplus._M_p;
      do {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(double *)_Var28._M_p;
        _Var28._M_p = _Var28._M_p + 8;
        auVar35 = vminsd_avx(auVar33,auVar35);
      } while (_Var28._M_p != (pointer)local_310._M_string_length);
      local_2c8 = auVar35._0_8_;
    }
    local_2c0 = (long)*(pointer *)&local_2e8->_M_use_count -
                (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_2e8->_vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data.
                      _M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_310._M_dataplus._M_p,
                      CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                               local_310.field_2._M_local_buf[0]) - (long)local_310._M_dataplus._M_p
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_238._M_dataplus._M_p,
                      local_238.field_2._M_allocated_capacity - (long)local_238._M_dataplus._M_p);
    }
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    auVar34._0_8_ = std::__cxx11::string::_M_construct((ulong)&local_238,'\0');
    auVar34._8_56_ = extraout_var;
    auVar35 = auVar34._0_16_;
    poplar::
    short_realname<poplar::map<poplar::plain_fkhash_trie<90u,poplar::hash::vigna_hasher>,poplar::compact_fkhash_nlm<int,8ul>>>
              ();
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"map_name",8);
    local_298._0_1_ = (allocator_type)0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_298,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar19,local_310._M_dataplus._M_p,local_310._M_string_length);
    local_298 = (map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
                 *)CONCAT71(local_298._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_298,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,
                      CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                               local_310.field_2._M_local_buf[0]) + 1);
    }
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"key_fn",6);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar19,(char *)local_288,local_280);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"query_fn",8);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar19,(char *)local_268,local_260);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"init_capa_bits",0xe);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"rss_bytes",9);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"rss_MiB",7);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    auVar35 = vcvtusi2sd_avx512f(auVar35,local_248);
    poVar19 = std::ostream::_M_insert<double>(auVar35._0_8_ * 9.5367431640625e-07);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"num_keys",8);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"num_queries",0xb);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"runs",4);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,SUB84(__n_00,0));
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"insert_us_per_key",0x11);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<double>(local_2a8);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"best_insert_us_per_key",0x16);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<double>(local_2b0);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"search_us_per_query",0x13);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<double>(local_2b8);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"best_search_us_per_query",0x18);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<double>(local_2c8);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"ok",2);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"ng",2);
    local_310._M_dataplus._M_p._0_1_ = 0x3a;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    local_310._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_310,1);
    if (local_2e9 != '\0') {
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"map",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,":\n",2);
      poplar::
      map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
      ::show_stats(local_2a0,(ostream *)&std::cout,1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    iVar11 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: failed to open ",0x16);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_288,local_280);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
LAB_00135b87:
    std::ifstream::~ifstream(&local_238);
LAB_00135b94:
    iVar11 = 1;
  }
  if (_Stack_2e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2e0._M_pi);
  }
  if (_Stack_2d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2d0._M_pi);
  }
LAB_00135bb7:
  pmVar18 = local_290;
  if (local_290 !=
      (map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_8UL>_>
       *)0x0) {
    poplar::compact_fkhash_nlm<int,_8UL>::~compact_fkhash_nlm(&local_290->label_store_);
    poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::~plain_fkhash_trie
              (&pmVar18->hash_trie_);
    operator_delete(pmVar18,0x1f0);
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  return iVar11;
}

Assistant:

int bench(const cmdline::parser& p) {
    auto key_fn = p.get<std::string>("key_fn");
    auto query_fn = p.get<std::string>("query_fn");
    auto capa_bits = p.get<uint32_t>("capa_bits");
    auto lambda = p.get<uint64_t>("lambda");
    auto runs = p.get<int>("runs");
    auto detail = p.get<bool>("detail");

    uint64_t num_keys = 0, num_queries = 0;
    uint64_t ok = 0, ng = 0;
    uint64_t process_size = get_process_size();

    double insert_us_per_key = 0.0, search_us_per_query = 0.0;
    double best_insert_us_per_key = 0.0, best_search_us_per_query = 0.0;

    auto map = std::make_unique<Map>(capa_bits, lambda);
    {
        std::ifstream ifs{key_fn};
        if (!ifs) {
            std::cerr << "error: failed to open " << key_fn << std::endl;
            return 1;
        }

        std::string key;
        key.reserve(1024);

        while (std::getline(ifs, key)) {
            *map->update(key) = 1;
            ++num_keys;
        }
        process_size = get_process_size() - process_size;
    }

    std::shared_ptr<std::vector<std::string>> keys;
    std::shared_ptr<std::vector<std::string>> queries;

    {
        std::ifstream ifs{key_fn};
        if (!ifs) {
            std::cerr << "Error: failed to open " << key_fn << std::endl;
            return 1;
        }

        keys = std::make_shared<std::vector<std::string>>();
        keys->reserve(num_keys);

        for (std::string line; std::getline(ifs, line);) {
            keys->push_back(line);
        }
    }

    if (query_fn != "-") {
        std::ifstream ifs{query_fn};
        if (!ifs) {
            std::cerr << "Error: failed to open " << query_fn << std::endl;
            return 1;
        }

        queries = std::make_shared<std::vector<std::string>>();

        for (std::string line; std::getline(ifs, line);) {
            queries->push_back(line);
        }
        queries->shrink_to_fit();
    } else {
        queries = keys;
    }

    {
        std::vector<double> insert_times(runs);
        std::vector<double> search_times(runs);

        for (int i = 0; i < runs; ++i) {
            auto map = std::make_unique<Map>(capa_bits, lambda);

            // insertion
            {
                timer t;
                for (const std::string& key : *keys) {
                    *map->update(key) = 1;
                }
                insert_times[i] = t.get<std::micro>() / keys->size();
            }

            // retrieval
            size_t _ok = 0, _ng = 0;
            {
                timer t;
                for (const std::string& query : *queries) {
                    auto ptr = map->find(query);
                    if (ptr != nullptr and *ptr == 1) {
                        ++_ok;
                    } else {
                        ++_ng;
                    }
                }
                search_times[i] = t.get<std::micro>() / queries->size();
            }

            if (i != 0) {
                if ((ok != _ok) or (ng != _ng)) {
                    std::cerr << "critical error for search results" << std::endl;
                    return 1;
                }
            }

            ok = _ok;
            ng = _ng;
        }

        num_keys = keys->size();
        num_queries = queries->size();
        insert_us_per_key = get_average(insert_times);
        best_insert_us_per_key = get_min(insert_times);
        search_us_per_query = get_average(search_times);
        best_search_us_per_query = get_min(search_times);
    }

    std::ostream& out = std::cout;
    auto indent = get_indent(0);

    show_stat(out, indent, "map_name", short_realname<Map>());
    show_stat(out, indent, "key_fn", key_fn);
    show_stat(out, indent, "query_fn", query_fn);
    show_stat(out, indent, "init_capa_bits", capa_bits);

    show_stat(out, indent, "rss_bytes", process_size);
    show_stat(out, indent, "rss_MiB", process_size / (1024.0 * 1024.0));

    show_stat(out, indent, "num_keys", num_keys);
    show_stat(out, indent, "num_queries", num_queries);

    show_stat(out, indent, "runs", runs);
    show_stat(out, indent, "insert_us_per_key", insert_us_per_key);
    show_stat(out, indent, "best_insert_us_per_key", best_insert_us_per_key);
    show_stat(out, indent, "search_us_per_query", search_us_per_query);
    show_stat(out, indent, "best_search_us_per_query", best_search_us_per_query);

    show_stat(out, indent, "ok", ok);
    show_stat(out, indent, "ng", ng);

    if (detail) {
        show_member(out, indent, "map");
        map->show_stats(out, 1);
    }

    return 0;
}